

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int is_ref_frame_used_in_cache(MV_REFERENCE_FRAME ref_frame,MB_MODE_INFO *mi_cache)

{
  int8_t iVar1;
  long in_RSI;
  char in_DIL;
  MV_REFERENCE_FRAME cached_ref_type;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  bool bVar2;
  undefined1 in_stack_ffffffffffffffef;
  undefined4 local_4;
  
  if (in_RSI == 0) {
    local_4 = 0;
  }
  else if (in_DIL < '\b') {
    bVar2 = true;
    if (in_DIL != *(char *)(in_RSI + 0x10)) {
      bVar2 = in_DIL == *(char *)(in_RSI + 0x11);
    }
    local_4 = (uint)bVar2;
  }
  else {
    iVar1 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                               CONCAT17(in_stack_ffffffffffffffef,
                                        CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8
                                                )));
    local_4 = (uint)(in_DIL == iVar1);
  }
  return local_4;
}

Assistant:

static inline int is_ref_frame_used_in_cache(MV_REFERENCE_FRAME ref_frame,
                                             const MB_MODE_INFO *mi_cache) {
  if (!mi_cache) {
    return 0;
  }

  if (ref_frame < REF_FRAMES) {
    return (ref_frame == mi_cache->ref_frame[0] ||
            ref_frame == mi_cache->ref_frame[1]);
  }

  // if we are here, then the current mode is compound.
  MV_REFERENCE_FRAME cached_ref_type = av1_ref_frame_type(mi_cache->ref_frame);
  return ref_frame == cached_ref_type;
}